

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddSymmetry.c
# Opt level: O0

int cuddSymmSifting(DdManager *table,int lower,int upper)

{
  abctime aVar1;
  int local_4c;
  int local_44;
  int local_40;
  int symgroups;
  int symvars;
  int result;
  int x;
  int size;
  int *var;
  int local_20;
  int i;
  int upper_local;
  int lower_local;
  DdManager *table_local;
  
  result = table->size;
  _x = (void *)0x0;
  local_20 = upper;
  i = lower;
  _upper_local = table;
  entry = (int *)malloc((long)result << 2);
  if (entry == (int *)0x0) {
    _upper_local->errorCode = CUDD_MEMORY_OUT;
  }
  else {
    _x = malloc((long)result << 2);
    if (_x == (void *)0x0) {
      _upper_local->errorCode = CUDD_MEMORY_OUT;
    }
    else {
      for (var._4_4_ = 0; (int)var._4_4_ < result; var._4_4_ = var._4_4_ + 1) {
        symvars = _upper_local->perm[(int)var._4_4_];
        entry[(int)var._4_4_] = _upper_local->subtables[symvars].keys;
        *(uint *)((long)_x + (long)(int)var._4_4_ * 4) = var._4_4_;
      }
      qsort(_x,(long)result,4,ddSymmUniqueCompare);
      for (var._4_4_ = i; (int)var._4_4_ <= local_20; var._4_4_ = var._4_4_ + 1) {
        _upper_local->subtables[(int)var._4_4_].next = var._4_4_;
      }
      var._4_4_ = 0;
      while( true ) {
        if (result < _upper_local->siftMaxVar) {
          local_4c = result;
        }
        else {
          local_4c = _upper_local->siftMaxVar;
        }
        if (((local_4c <= (int)var._4_4_) || (_upper_local->siftMaxSwap <= ddTotalNumberSwapping))
           || ((_upper_local->TimeStop != 0 && (aVar1 = Abc_Clock(), _upper_local->TimeStop < aVar1)
               ))) {
          if (_x != (void *)0x0) {
            free(_x);
            _x = (void *)0x0;
          }
          if (entry != (int *)0x0) {
            free(entry);
            entry = (int *)0x0;
          }
          ddSymmSummary(_upper_local,i,local_20,&local_40,&local_44);
          return local_40 + 1;
        }
        symvars = _upper_local->perm[*(int *)((long)_x + (long)(int)var._4_4_ * 4)];
        if ((((i <= symvars) && (symvars <= local_20)) &&
            (_upper_local->subtables[symvars].next == symvars)) &&
           (symgroups = ddSymmSiftingAux(_upper_local,symvars,i,local_20), symgroups == 0)) break;
        var._4_4_ = var._4_4_ + 1;
      }
      symgroups = 0;
    }
  }
  if ((entry != (int *)0x0) && (entry != (int *)0x0)) {
    free(entry);
    entry = (int *)0x0;
  }
  if ((_x != (void *)0x0) && (_x != (void *)0x0)) {
    free(_x);
  }
  return 0;
}

Assistant:

int
cuddSymmSifting(
  DdManager * table,
  int  lower,
  int  upper)
{
    int         i;
    int         *var;
    int         size;
    int         x;
    int         result;
    int         symvars;
    int         symgroups;
#ifdef DD_STATS
    int         previousSize;
#endif

    size = table->size;

    /* Find order in which to sift variables. */
    var = NULL;
    entry = ABC_ALLOC(int,size);
    if (entry == NULL) {
        table->errorCode = CUDD_MEMORY_OUT;
        goto ddSymmSiftingOutOfMem;
    }
    var = ABC_ALLOC(int,size);
    if (var == NULL) {
        table->errorCode = CUDD_MEMORY_OUT;
        goto ddSymmSiftingOutOfMem;
    }

    for (i = 0; i < size; i++) {
        x = table->perm[i];
        entry[i] = table->subtables[x].keys;
        var[i] = i;
    }

    qsort((void *)var,size,sizeof(int),(DD_QSFP)ddSymmUniqueCompare);

    /* Initialize the symmetry of each subtable to itself. */
    for (i = lower; i <= upper; i++) {
        table->subtables[i].next = i;
    }

    for (i = 0; i < ddMin(table->siftMaxVar,size); i++) {
        if (ddTotalNumberSwapping >= table->siftMaxSwap)
            break;
        // enable timeout during variable reodering - alanmi 2/13/11
        if ( table->TimeStop && Abc_Clock() > table->TimeStop )
            break;
        x = table->perm[var[i]];
#ifdef DD_STATS
        previousSize = table->keys - table->isolated;
#endif
        if (x < lower || x > upper) continue;
        if (table->subtables[x].next == (unsigned) x) {
            result = ddSymmSiftingAux(table,x,lower,upper);
            if (!result) goto ddSymmSiftingOutOfMem;
#ifdef DD_STATS
            if (table->keys < (unsigned) previousSize + table->isolated) {
                (void) fprintf(table->out,"-");
            } else if (table->keys > (unsigned) previousSize +
                       table->isolated) {
                (void) fprintf(table->out,"+"); /* should never happen */
            } else {
                (void) fprintf(table->out,"=");
            }
            fflush(table->out);
#endif
        }
    }

    ABC_FREE(var);
    ABC_FREE(entry);

    ddSymmSummary(table, lower, upper, &symvars, &symgroups);

#ifdef DD_STATS
    (void) fprintf(table->out, "\n#:S_SIFTING %8d: symmetric variables\n",
                   symvars);
    (void) fprintf(table->out, "#:G_SIFTING %8d: symmetric groups",
                   symgroups);
#endif

    return(1+symvars);

ddSymmSiftingOutOfMem:

    if (entry != NULL) ABC_FREE(entry);
    if (var != NULL) ABC_FREE(var);

    return(0);

}